

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O1

void history_find_artifact(player *p,artifact *artifact)

{
  bitflag *pbVar1;
  size_t sVar2;
  history_info *phVar3;
  long lVar4;
  artifact *in_RDX;
  artifact *extraout_RDX;
  long lVar5;
  long lVar6;
  bitflag flags [2];
  char text [80];
  char o_name [80];
  bitflag local_ca [2];
  char local_c8 [80];
  char local_78 [88];
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-history.c"
                  ,0xe1,"void history_find_artifact(struct player *, const struct artifact *)");
  }
  sVar2 = (p->hist).next;
  lVar5 = sVar2 * -0x5c;
  lVar4 = sVar2 * 0x5c + -0x56;
  lVar6 = sVar2 + 1;
  do {
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) goto LAB_001ba1fa;
    lVar5 = lVar5 + 0x5c;
    phVar3 = (p->hist).entries;
    pbVar1 = phVar3->type + lVar4;
    lVar4 = lVar4 + -0x5c;
  } while (artifact->aidx != (uint)*pbVar1);
  flag_off((bitflag *)((long)phVar3 - lVar5),2,2);
  flag_on_dbg((bitflag *)((long)(p->hist).entries - lVar5),2,3,"h->entries[i].type",
              "HIST_ARTIFACT_KNOWN");
  in_RDX = extraout_RDX;
  if (lVar6 == 0) {
LAB_001ba1fa:
    get_artifact_name(local_78,(size_t)artifact,in_RDX);
    strnfmt(local_c8,0x50,"Found %s",local_78);
    flag_wipe(local_ca,2);
    flag_on_dbg(local_ca,2,3,"flags","HIST_ARTIFACT_KNOWN");
    history_add_full(p,local_ca,artifact->aidx,(int)p->place,(int)p->lev,p->total_energy / 100,
                     local_c8);
  }
  return;
}

Assistant:

void history_find_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try revealing any existing artifact, otherwise log it */
	if (!history_mark_artifact_known(&p->hist, artifact)) {
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Found %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_KNOWN);

		history_add_with_flags(p, text, flags, artifact);
	}
}